

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::Inserter::insertOne
          (Inserter *this,qsizetype pos,OrderedScreen *t)

{
  undefined8 *puVar1;
  QArrayDataPointer<QKmsPlane> *this_00;
  OrderedScreen *pOVar2;
  qsizetype qVar3;
  OrderedScreen *pOVar4;
  undefined8 uVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  Data *pDVar8;
  _drmModeModeInfo *p_Var9;
  Data *pDVar10;
  QKmsPlane *pQVar11;
  qreal qVar12;
  drmModePropertyPtr p_Var13;
  drmModePropertyBlobPtr p_Var14;
  QSize QVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  Data *pDVar22;
  qreal qVar23;
  int iVar24;
  Representation RVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  undefined4 uVar28;
  bool bVar29;
  undefined7 uVar30;
  undefined3 uVar31;
  bool bVar32;
  bool bVar33;
  undefined3 uVar34;
  uint32_t uVar35;
  undefined3 uVar36;
  uint32_t uVar37;
  int iVar38;
  long lVar39;
  long lVar40;
  
  pOVar2 = this->begin;
  lVar39 = this->size;
  pOVar4 = pOVar2 + lVar39;
  this->end = pOVar4;
  this->last = pOVar2 + lVar39 + -1;
  lVar39 = lVar39 - pos;
  this->where = pOVar2 + pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar39;
  this->sourceCopyAssign = 1;
  if (lVar39 < 1) {
    this->sourceCopyConstruct = 1 - lVar39;
    this->move = 0;
    this->sourceCopyAssign = lVar39;
    pOVar4->screen = t->screen;
    RVar25.m_i = (t->vinfo).virtualPos.xp.m_i;
    uVar5 = *(undefined8 *)((long)&(t->vinfo).virtualPos.xp.m_i + 1);
    (pOVar4->vinfo).virtualIndex = (t->vinfo).virtualIndex;
    (pOVar4->vinfo).virtualPos.xp = (Representation)RVar25.m_i;
    *(undefined8 *)((long)&(pOVar4->vinfo).virtualPos.xp.m_i + 1) = uVar5;
    pDVar6 = (t->vinfo).output.name.d.d;
    (t->vinfo).output.name.d.d = (Data *)0x0;
    (pOVar4->vinfo).output.name.d.d = pDVar6;
    pcVar7 = (t->vinfo).output.name.d.ptr;
    (t->vinfo).output.name.d.ptr = (char16_t *)0x0;
    (pOVar4->vinfo).output.name.d.ptr = pcVar7;
    qVar3 = (t->vinfo).output.name.d.size;
    (t->vinfo).output.name.d.size = 0;
    (pOVar4->vinfo).output.name.d.size = qVar3;
    uVar26 = (t->vinfo).output.crtc_index;
    uVar27 = (t->vinfo).output.crtc_id;
    uVar28 = *(undefined4 *)&(t->vinfo).output.field_0x24;
    qVar12 = (t->vinfo).output.physical_size.wd;
    qVar23 = (t->vinfo).output.physical_size.ht;
    iVar24 = (t->vinfo).output.preferred_mode;
    iVar38 = (t->vinfo).output.mode;
    bVar29 = (t->vinfo).output.mode_set;
    uVar30 = *(undefined7 *)&(t->vinfo).output.field_0x41;
    (pOVar4->vinfo).output.connector_id = (t->vinfo).output.connector_id;
    (pOVar4->vinfo).output.crtc_index = uVar26;
    (pOVar4->vinfo).output.crtc_id = uVar27;
    *(undefined4 *)&(pOVar4->vinfo).output.field_0x24 = uVar28;
    (pOVar4->vinfo).output.physical_size.wd = qVar12;
    (pOVar4->vinfo).output.physical_size.ht = qVar23;
    (pOVar4->vinfo).output.preferred_mode = iVar24;
    (pOVar4->vinfo).output.mode = iVar38;
    (pOVar4->vinfo).output.mode_set = bVar29;
    *(undefined7 *)&(pOVar4->vinfo).output.field_0x41 = uVar30;
    (pOVar4->vinfo).output.saved_crtc = (t->vinfo).output.saved_crtc;
    pDVar8 = (t->vinfo).output.modes.d.d;
    (t->vinfo).output.modes.d.d = (Data *)0x0;
    (pOVar4->vinfo).output.modes.d.d = pDVar8;
    p_Var9 = (t->vinfo).output.modes.d.ptr;
    (t->vinfo).output.modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar4->vinfo).output.modes.d.ptr = p_Var9;
    qVar3 = (t->vinfo).output.modes.d.size;
    (t->vinfo).output.modes.d.size = 0;
    (pOVar4->vinfo).output.modes.d.size = qVar3;
    uVar28 = *(undefined4 *)&(t->vinfo).output.field_0x6c;
    p_Var13 = (t->vinfo).output.dpms_prop;
    p_Var14 = (t->vinfo).output.edid_blob;
    bVar29 = (t->vinfo).output.wants_forced_plane;
    uVar31 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar26 = (t->vinfo).output.forced_plane_id;
    uVar34 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar27 = (t->vinfo).output.forced_plane_id;
    bVar32 = (t->vinfo).output.forced_plane_set;
    uVar36 = *(undefined3 *)&(t->vinfo).output.field_0x89;
    uVar35 = (t->vinfo).output.drm_format;
    bVar33 = (t->vinfo).output.drm_format_requested_by_user;
    (pOVar4->vinfo).output.subpixel = (t->vinfo).output.subpixel;
    *(undefined4 *)&(pOVar4->vinfo).output.field_0x6c = uVar28;
    (pOVar4->vinfo).output.dpms_prop = p_Var13;
    (pOVar4->vinfo).output.edid_blob = p_Var14;
    (pOVar4->vinfo).output.wants_forced_plane = bVar29;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x81 = uVar31;
    (pOVar4->vinfo).output.forced_plane_id = uVar26;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x81 = uVar34;
    (pOVar4->vinfo).output.forced_plane_id = uVar27;
    (pOVar4->vinfo).output.forced_plane_set = bVar32;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x89 = uVar36;
    (pOVar4->vinfo).output.drm_format = uVar35;
    (pOVar4->vinfo).output.drm_format_requested_by_user = bVar33;
    pDVar6 = (t->vinfo).output.clone_source.d.d;
    (t->vinfo).output.clone_source.d.d = (Data *)0x0;
    (pOVar4->vinfo).output.clone_source.d.d = pDVar6;
    pcVar7 = (t->vinfo).output.clone_source.d.ptr;
    (t->vinfo).output.clone_source.d.ptr = (char16_t *)0x0;
    (pOVar4->vinfo).output.clone_source.d.ptr = pcVar7;
    qVar3 = (t->vinfo).output.clone_source.d.size;
    (t->vinfo).output.clone_source.d.size = 0;
    (pOVar4->vinfo).output.clone_source.d.size = qVar3;
    pDVar10 = (t->vinfo).output.available_planes.d.d;
    (t->vinfo).output.available_planes.d.d = (Data *)0x0;
    (pOVar4->vinfo).output.available_planes.d.d = pDVar10;
    pQVar11 = (t->vinfo).output.available_planes.d.ptr;
    (t->vinfo).output.available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar4->vinfo).output.available_planes.d.ptr = pQVar11;
    qVar3 = (t->vinfo).output.available_planes.d.size;
    (t->vinfo).output.available_planes.d.size = 0;
    (pOVar4->vinfo).output.available_planes.d.size = qVar3;
    QVar15 = (t->vinfo).output.size;
    uVar26 = (t->vinfo).output.crtcIdPropertyId;
    uVar27 = (t->vinfo).output.modeIdPropertyId;
    uVar35 = (t->vinfo).output.activePropertyId;
    uVar37 = (t->vinfo).output.mode_blob_id;
    (pOVar4->vinfo).output.eglfs_plane = (t->vinfo).output.eglfs_plane;
    (pOVar4->vinfo).output.size = QVar15;
    (pOVar4->vinfo).output.crtcIdPropertyId = uVar26;
    (pOVar4->vinfo).output.modeIdPropertyId = uVar27;
    (pOVar4->vinfo).output.activePropertyId = uVar35;
    (pOVar4->vinfo).output.mode_blob_id = uVar37;
    this->size = this->size + 1;
  }
  else {
    iVar24 = pOVar4[-1].vinfo.virtualIndex;
    RVar25.m_i = pOVar4[-1].vinfo.virtualPos.xp.m_i;
    pOVar4->screen = pOVar4[-1].screen;
    (pOVar4->vinfo).virtualIndex = iVar24;
    (pOVar4->vinfo).virtualPos.xp = (Representation)RVar25.m_i;
    *(undefined8 *)((long)&(pOVar4->vinfo).virtualPos.xp.m_i + 1) =
         *(undefined8 *)((long)&pOVar4[-1].vinfo.virtualPos.xp.m_i + 1);
    pDVar6 = pOVar4[-1].vinfo.output.name.d.d;
    pcVar7 = pOVar4[-1].vinfo.output.name.d.ptr;
    pOVar4[-1].vinfo.output.name.d.d = (Data *)0x0;
    pOVar4[-1].vinfo.output.name.d.ptr = (char16_t *)0x0;
    (pOVar4->vinfo).output.name.d.d = pDVar6;
    (pOVar4->vinfo).output.name.d.ptr = pcVar7;
    qVar3 = pOVar4[-1].vinfo.output.name.d.size;
    pOVar4[-1].vinfo.output.name.d.size = 0;
    (pOVar4->vinfo).output.name.d.size = qVar3;
    uVar26 = pOVar4[-1].vinfo.output.crtc_index;
    uVar27 = pOVar4[-1].vinfo.output.crtc_id;
    uVar28 = *(undefined4 *)&pOVar4[-1].vinfo.output.field_0x24;
    (pOVar4->vinfo).output.connector_id = pOVar4[-1].vinfo.output.connector_id;
    (pOVar4->vinfo).output.crtc_index = uVar26;
    (pOVar4->vinfo).output.crtc_id = uVar27;
    *(undefined4 *)&(pOVar4->vinfo).output.field_0x24 = uVar28;
    qVar12 = pOVar4[-1].vinfo.output.physical_size.ht;
    (pOVar4->vinfo).output.physical_size.wd = pOVar4[-1].vinfo.output.physical_size.wd;
    (pOVar4->vinfo).output.physical_size.ht = qVar12;
    iVar24 = pOVar4[-1].vinfo.output.mode;
    bVar29 = pOVar4[-1].vinfo.output.mode_set;
    uVar30 = *(undefined7 *)&pOVar4[-1].vinfo.output.field_0x41;
    (pOVar4->vinfo).output.preferred_mode = pOVar4[-1].vinfo.output.preferred_mode;
    (pOVar4->vinfo).output.mode = iVar24;
    (pOVar4->vinfo).output.mode_set = bVar29;
    *(undefined7 *)&(pOVar4->vinfo).output.field_0x41 = uVar30;
    (pOVar4->vinfo).output.saved_crtc = pOVar4[-1].vinfo.output.saved_crtc;
    pDVar8 = pOVar4[-1].vinfo.output.modes.d.d;
    p_Var9 = pOVar4[-1].vinfo.output.modes.d.ptr;
    pOVar4[-1].vinfo.output.modes.d.d = (Data *)0x0;
    pOVar4[-1].vinfo.output.modes.d.ptr = (_drmModeModeInfo *)0x0;
    (pOVar4->vinfo).output.modes.d.d = pDVar8;
    (pOVar4->vinfo).output.modes.d.ptr = p_Var9;
    qVar3 = pOVar4[-1].vinfo.output.modes.d.size;
    pOVar4[-1].vinfo.output.modes.d.size = 0;
    (pOVar4->vinfo).output.modes.d.size = qVar3;
    iVar24 = pOVar4[-1].vinfo.output.subpixel;
    uVar28 = *(undefined4 *)&pOVar4[-1].vinfo.output.field_0x6c;
    p_Var13 = pOVar4[-1].vinfo.output.dpms_prop;
    p_Var14 = pOVar4[-1].vinfo.output.edid_blob;
    bVar33 = pOVar4[-1].vinfo.output.wants_forced_plane;
    uVar34 = *(undefined3 *)&pOVar4[-1].vinfo.output.field_0x81;
    uVar35 = pOVar4[-1].vinfo.output.forced_plane_id;
    uVar26 = pOVar4[-1].vinfo.output.forced_plane_id;
    bVar29 = pOVar4[-1].vinfo.output.forced_plane_set;
    uVar31 = *(undefined3 *)&pOVar4[-1].vinfo.output.field_0x89;
    uVar27 = pOVar4[-1].vinfo.output.drm_format;
    bVar32 = pOVar4[-1].vinfo.output.drm_format_requested_by_user;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x81 =
         *(undefined3 *)&pOVar4[-1].vinfo.output.field_0x81;
    (pOVar4->vinfo).output.forced_plane_id = uVar26;
    (pOVar4->vinfo).output.forced_plane_set = bVar29;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x89 = uVar31;
    (pOVar4->vinfo).output.drm_format = uVar27;
    (pOVar4->vinfo).output.drm_format_requested_by_user = bVar32;
    (pOVar4->vinfo).output.edid_blob = p_Var14;
    (pOVar4->vinfo).output.wants_forced_plane = bVar33;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x81 = uVar34;
    (pOVar4->vinfo).output.forced_plane_id = uVar35;
    (pOVar4->vinfo).output.subpixel = iVar24;
    *(undefined4 *)&(pOVar4->vinfo).output.field_0x6c = uVar28;
    (pOVar4->vinfo).output.dpms_prop = p_Var13;
    pDVar6 = pOVar4[-1].vinfo.output.clone_source.d.d;
    pcVar7 = pOVar4[-1].vinfo.output.clone_source.d.ptr;
    pOVar4[-1].vinfo.output.clone_source.d.d = (Data *)0x0;
    pOVar4[-1].vinfo.output.clone_source.d.ptr = (char16_t *)0x0;
    (pOVar4->vinfo).output.clone_source.d.d = pDVar6;
    (pOVar4->vinfo).output.clone_source.d.ptr = pcVar7;
    qVar3 = pOVar4[-1].vinfo.output.clone_source.d.size;
    pOVar4[-1].vinfo.output.clone_source.d.size = 0;
    (pOVar4->vinfo).output.clone_source.d.size = qVar3;
    pDVar10 = pOVar4[-1].vinfo.output.available_planes.d.d;
    pQVar11 = pOVar4[-1].vinfo.output.available_planes.d.ptr;
    pOVar4[-1].vinfo.output.available_planes.d.d = (Data *)0x0;
    pOVar4[-1].vinfo.output.available_planes.d.ptr = (QKmsPlane *)0x0;
    (pOVar4->vinfo).output.available_planes.d.d = pDVar10;
    (pOVar4->vinfo).output.available_planes.d.ptr = pQVar11;
    qVar3 = pOVar4[-1].vinfo.output.available_planes.d.size;
    pOVar4[-1].vinfo.output.available_planes.d.size = 0;
    (pOVar4->vinfo).output.available_planes.d.size = qVar3;
    pQVar11 = pOVar4[-1].vinfo.output.eglfs_plane;
    QVar15 = pOVar4[-1].vinfo.output.size;
    uVar26 = pOVar4[-1].vinfo.output.modeIdPropertyId;
    uVar27 = pOVar4[-1].vinfo.output.activePropertyId;
    uVar35 = pOVar4[-1].vinfo.output.mode_blob_id;
    (pOVar4->vinfo).output.crtcIdPropertyId = pOVar4[-1].vinfo.output.crtcIdPropertyId;
    (pOVar4->vinfo).output.modeIdPropertyId = uVar26;
    (pOVar4->vinfo).output.activePropertyId = uVar27;
    (pOVar4->vinfo).output.mode_blob_id = uVar35;
    (pOVar4->vinfo).output.eglfs_plane = pQVar11;
    (pOVar4->vinfo).output.size = QVar15;
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar40 = 0;
      lVar39 = 0;
      do {
        pOVar4 = this->last;
        puVar1 = (undefined8 *)((long)&pOVar4->screen + lVar40);
        *puVar1 = puVar1[-0x20];
        puVar1[1] = puVar1[-0x1f];
        *(undefined8 *)((long)puVar1 + 0xd) = *(undefined8 *)((long)puVar1 + -0xf3);
        uVar5 = puVar1[3];
        uVar16 = puVar1[4];
        puVar1[3] = puVar1[-0x1d];
        puVar1[4] = puVar1[-0x1c];
        puVar1[-0x1d] = uVar5;
        puVar1[-0x1c] = uVar16;
        uVar5 = puVar1[5];
        puVar1[5] = puVar1[-0x1b];
        puVar1[-0x1b] = uVar5;
        puVar1[6] = puVar1[-0x1a];
        puVar1[7] = puVar1[-0x19];
        puVar1[8] = puVar1[-0x18];
        puVar1[9] = puVar1[-0x17];
        puVar1[10] = puVar1[-0x16];
        puVar1[0xb] = puVar1[-0x15];
        puVar1[0xc] = puVar1[-0x14];
        QArrayDataPointer<_drmModeModeInfo>::operator=
                  ((QArrayDataPointer<_drmModeModeInfo> *)(puVar1 + 0xd),
                   (QArrayDataPointer<_drmModeModeInfo> *)((long)pOVar4 + lVar40 + -0x98));
        uVar5 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x78);
        uVar16 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x70);
        uVar17 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x68);
        uVar18 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x67);
        uVar19 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x5f);
        uVar20 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x50);
        uVar21 = *(undefined8 *)((long)pOVar4 + lVar40 + -0x48);
        puVar1[0x10] = *(undefined8 *)((long)pOVar4 + lVar40 + -0x80);
        puVar1[0x11] = uVar5;
        puVar1[0x12] = uVar16;
        puVar1[0x13] = uVar17;
        *(undefined8 *)((long)puVar1 + 0x99) = uVar18;
        *(undefined8 *)((long)puVar1 + 0xa1) = uVar19;
        uVar5 = puVar1[0x16];
        uVar16 = puVar1[0x17];
        puVar1[0x16] = uVar20;
        puVar1[0x17] = uVar21;
        *(undefined8 *)((long)pOVar4 + lVar40 + -0x50) = uVar5;
        *(undefined8 *)((long)pOVar4 + lVar40 + -0x48) = uVar16;
        uVar5 = puVar1[0x18];
        puVar1[0x18] = *(undefined8 *)((long)pOVar4 + lVar40 + -0x40);
        *(undefined8 *)((long)pOVar4 + lVar40 + -0x40) = uVar5;
        this_00 = (QArrayDataPointer<QKmsPlane> *)
                  ((long)&(pOVar4->vinfo).output.available_planes.d.d + lVar40);
        QArrayDataPointer<QKmsPlane>::operator=
                  (this_00,(QArrayDataPointer<QKmsPlane> *)((long)pOVar4 + lVar40 + -0x38));
        pDVar10 = *(Data **)((long)pOVar4 + lVar40 + -0x20);
        pQVar11 = *(QKmsPlane **)((long)pOVar4 + lVar40 + -0x18);
        pDVar22 = *(Data **)((long)pOVar4 + lVar40 + -8);
        this_00[1].size = *(qsizetype *)((long)pOVar4 + lVar40 + -0x10);
        this_00[2].d = pDVar22;
        this_00[1].d = pDVar10;
        this_00[1].ptr = pQVar11;
        lVar39 = lVar39 + -1;
        lVar40 = lVar40 + -0x100;
      } while (lVar39 != this->move);
    }
    pOVar4 = this->where;
    pOVar4->screen = t->screen;
    RVar25.m_i = (t->vinfo).virtualPos.xp.m_i;
    uVar5 = *(undefined8 *)((long)&(t->vinfo).virtualPos.xp.m_i + 1);
    (pOVar4->vinfo).virtualIndex = (t->vinfo).virtualIndex;
    (pOVar4->vinfo).virtualPos.xp = (Representation)RVar25.m_i;
    *(undefined8 *)((long)&(pOVar4->vinfo).virtualPos.xp.m_i + 1) = uVar5;
    pDVar6 = (pOVar4->vinfo).output.name.d.d;
    (pOVar4->vinfo).output.name.d.d = (t->vinfo).output.name.d.d;
    (t->vinfo).output.name.d.d = pDVar6;
    pcVar7 = (pOVar4->vinfo).output.name.d.ptr;
    (pOVar4->vinfo).output.name.d.ptr = (t->vinfo).output.name.d.ptr;
    (t->vinfo).output.name.d.ptr = pcVar7;
    qVar3 = (pOVar4->vinfo).output.name.d.size;
    (pOVar4->vinfo).output.name.d.size = (t->vinfo).output.name.d.size;
    (t->vinfo).output.name.d.size = qVar3;
    (pOVar4->vinfo).output.saved_crtc = (t->vinfo).output.saved_crtc;
    uVar26 = (t->vinfo).output.connector_id;
    uVar27 = (t->vinfo).output.crtc_index;
    uVar35 = (t->vinfo).output.crtc_id;
    uVar28 = *(undefined4 *)&(t->vinfo).output.field_0x24;
    qVar12 = (t->vinfo).output.physical_size.wd;
    qVar23 = (t->vinfo).output.physical_size.ht;
    iVar24 = (t->vinfo).output.mode;
    bVar29 = (t->vinfo).output.mode_set;
    uVar30 = *(undefined7 *)&(t->vinfo).output.field_0x41;
    (pOVar4->vinfo).output.preferred_mode = (t->vinfo).output.preferred_mode;
    (pOVar4->vinfo).output.mode = iVar24;
    (pOVar4->vinfo).output.mode_set = bVar29;
    *(undefined7 *)&(pOVar4->vinfo).output.field_0x41 = uVar30;
    (pOVar4->vinfo).output.physical_size.wd = qVar12;
    (pOVar4->vinfo).output.physical_size.ht = qVar23;
    (pOVar4->vinfo).output.connector_id = uVar26;
    (pOVar4->vinfo).output.crtc_index = uVar27;
    (pOVar4->vinfo).output.crtc_id = uVar35;
    *(undefined4 *)&(pOVar4->vinfo).output.field_0x24 = uVar28;
    QArrayDataPointer<_drmModeModeInfo>::operator=
              (&(pOVar4->vinfo).output.modes.d,&(t->vinfo).output.modes.d);
    uVar28 = *(undefined4 *)&(t->vinfo).output.field_0x6c;
    p_Var13 = (t->vinfo).output.dpms_prop;
    p_Var14 = (t->vinfo).output.edid_blob;
    bVar29 = (t->vinfo).output.wants_forced_plane;
    uVar31 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar26 = (t->vinfo).output.forced_plane_id;
    uVar34 = *(undefined3 *)&(t->vinfo).output.field_0x81;
    uVar27 = (t->vinfo).output.forced_plane_id;
    bVar32 = (t->vinfo).output.forced_plane_set;
    uVar36 = *(undefined3 *)&(t->vinfo).output.field_0x89;
    uVar35 = (t->vinfo).output.drm_format;
    bVar33 = (t->vinfo).output.drm_format_requested_by_user;
    (pOVar4->vinfo).output.subpixel = (t->vinfo).output.subpixel;
    *(undefined4 *)&(pOVar4->vinfo).output.field_0x6c = uVar28;
    (pOVar4->vinfo).output.dpms_prop = p_Var13;
    (pOVar4->vinfo).output.edid_blob = p_Var14;
    (pOVar4->vinfo).output.wants_forced_plane = bVar29;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x81 = uVar31;
    (pOVar4->vinfo).output.forced_plane_id = uVar26;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x81 = uVar34;
    (pOVar4->vinfo).output.forced_plane_id = uVar27;
    (pOVar4->vinfo).output.forced_plane_set = bVar32;
    *(undefined3 *)&(pOVar4->vinfo).output.field_0x89 = uVar36;
    (pOVar4->vinfo).output.drm_format = uVar35;
    (pOVar4->vinfo).output.drm_format_requested_by_user = bVar33;
    pDVar6 = (pOVar4->vinfo).output.clone_source.d.d;
    (pOVar4->vinfo).output.clone_source.d.d = (t->vinfo).output.clone_source.d.d;
    (t->vinfo).output.clone_source.d.d = pDVar6;
    pcVar7 = (pOVar4->vinfo).output.clone_source.d.ptr;
    (pOVar4->vinfo).output.clone_source.d.ptr = (t->vinfo).output.clone_source.d.ptr;
    (t->vinfo).output.clone_source.d.ptr = pcVar7;
    qVar3 = (pOVar4->vinfo).output.clone_source.d.size;
    (pOVar4->vinfo).output.clone_source.d.size = (t->vinfo).output.clone_source.d.size;
    (t->vinfo).output.clone_source.d.size = qVar3;
    QArrayDataPointer<QKmsPlane>::operator=
              (&(pOVar4->vinfo).output.available_planes.d,&(t->vinfo).output.available_planes.d);
    QVar15 = (t->vinfo).output.size;
    uVar26 = (t->vinfo).output.crtcIdPropertyId;
    uVar27 = (t->vinfo).output.modeIdPropertyId;
    uVar35 = (t->vinfo).output.activePropertyId;
    uVar37 = (t->vinfo).output.mode_blob_id;
    (pOVar4->vinfo).output.eglfs_plane = (t->vinfo).output.eglfs_plane;
    (pOVar4->vinfo).output.size = QVar15;
    (pOVar4->vinfo).output.crtcIdPropertyId = uVar26;
    (pOVar4->vinfo).output.modeIdPropertyId = uVar27;
    (pOVar4->vinfo).output.activePropertyId = uVar35;
    (pOVar4->vinfo).output.mode_blob_id = uVar37;
  }
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }